

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

int __thiscall jrtplib::RTPSources::CreateOwnSSRC(RTPSources *this,uint32_t ssrc)

{
  RTPInternalSourceData **srcdat;
  RTPInternalSourceData *pRVar1;
  RTPAddress *pRVar2;
  RTPMemoryManager *pRVar3;
  bool bVar4;
  int iVar5;
  HashElement *pHVar6;
  bool created;
  bool local_29;
  
  if (this->owndata != (RTPInternalSourceData *)0x0) {
    return -0x41;
  }
  pHVar6 = (this->sourcelist).table[ssrc % 0x207d];
  if (pHVar6 != (HashElement *)0x0) {
    bVar4 = false;
    do {
      if (pHVar6->key == ssrc) {
        bVar4 = true;
      }
      else {
        pHVar6 = pHVar6->hashnext;
      }
    } while ((!bVar4) && (pHVar6 != (HashElement *)0x0));
    if (bVar4) {
      return -0x44;
    }
  }
  srcdat = &this->owndata;
  iVar5 = ObtainSourceDataInstance(this,ssrc,srcdat,&local_29);
  if (iVar5 < 0) {
    *srcdat = (RTPInternalSourceData *)0x0;
  }
  else {
    pRVar1 = *srcdat;
    (pRVar1->super_RTPSourceData).ownssrc = true;
    (pRVar1->super_RTPSourceData).validated = true;
    pRVar2 = (pRVar1->super_RTPSourceData).rtpaddr;
    if (pRVar2 != (RTPAddress *)0x0) {
      pRVar3 = (pRVar1->super_RTPSourceData).super_RTPMemoryObject.mgr;
      if (pRVar3 == (RTPMemoryManager *)0x0) {
        (*pRVar2->_vptr_RTPAddress[4])(pRVar2);
      }
      else {
        (*pRVar2->_vptr_RTPAddress[3])(pRVar2);
        (**(code **)(*(long *)pRVar3 + 0x18))(pRVar3,pRVar2);
      }
      (pRVar1->super_RTPSourceData).rtpaddr = (RTPAddress *)0x0;
    }
    (pRVar1->super_RTPSourceData).isrtpaddrset = true;
    pRVar1 = *srcdat;
    pRVar2 = (pRVar1->super_RTPSourceData).rtcpaddr;
    if (pRVar2 != (RTPAddress *)0x0) {
      pRVar3 = (pRVar1->super_RTPSourceData).super_RTPMemoryObject.mgr;
      if (pRVar3 == (RTPMemoryManager *)0x0) {
        (*pRVar2->_vptr_RTPAddress[4])(pRVar2);
      }
      else {
        (*pRVar2->_vptr_RTPAddress[3])(pRVar2);
        (**(code **)(*(long *)pRVar3 + 0x18))(pRVar3,pRVar2);
      }
      (pRVar1->super_RTPSourceData).rtcpaddr = (RTPAddress *)0x0;
    }
    (pRVar1->super_RTPSourceData).isrtcpaddrset = true;
    this->activecount = this->activecount + 1;
    (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,this->owndata);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int RTPSources::CreateOwnSSRC(uint32_t ssrc)
{
	if (owndata != 0)
		return ERR_RTP_SOURCES_ALREADYHAVEOWNSSRC;
	if (GotEntry(ssrc))
		return ERR_RTP_SOURCES_SSRCEXISTS;

	int status;
	bool created;
	
	status = ObtainSourceDataInstance(ssrc,&owndata,&created);
	if (status < 0)
	{
		owndata = 0; // just to make sure
		return status;
	}
	owndata->SetOwnSSRC();	
	owndata->SetRTPDataAddress(0);
	owndata->SetRTCPDataAddress(0);

	// we've created a validated ssrc, so we should increase activecount
	activecount++;

	OnNewSource(owndata);
	return 0;
}